

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O3

shared_ptr<kratos::AssignStmt> __thiscall
kratos::FSM::get_next_state_stmt
          (FSM *this,Enum *enum_def,EnumVar *next_state,FSMState *state,FSMState *next_fsm_state,
          unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *state_name_mapping)

{
  element_type *peVar1;
  __node_base_ptr p_Var2;
  const_iterator cVar3;
  ulong uVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long *plVar5;
  long *plVar6;
  shared_ptr<kratos::AssignStmt> sVar7;
  _Hashtable<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *in_stack_00000008;
  undefined1 auStack_a0 [8];
  unordered_map<kratos::FSMState_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  debug_info;
  FSMState *next_fsm_state_local;
  undefined1 auStack_58 [8];
  __alloc_node_gen_t __alloc_node_gen;
  undefined8 local_48;
  uint local_38;
  
  debug_info._M_h._M_single_bucket = (__node_base_ptr)state_name_mapping;
  cVar3 = std::
          _Hashtable<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(in_stack_00000008,(key_type *)&debug_info._M_h._M_single_bucket);
  if (cVar3.
      super__Node_iterator_base<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  Enum::get_enum((Enum *)auStack_58,(string *)next_state);
  auStack_a0 = auStack_58;
  debug_info._M_h._M_buckets = (__buckets_ptr)__alloc_node_gen._M_h;
  auStack_58 = (undefined1  [8])0x0;
  __alloc_node_gen._M_h = (__hashtable_alloc *)0x0;
  Var::assign((Var *)this,(shared_ptr<kratos::Var> *)state,
              (AssignmentType)(element_type *)auStack_a0);
  if (debug_info._M_h._M_buckets != (__buckets_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)debug_info._M_h._M_buckets);
  }
  if (__alloc_node_gen._M_h != (__hashtable_alloc *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__alloc_node_gen._M_h);
  }
  auStack_a0 = (undefined1  [8])0x0;
  debug_info._M_h._M_buckets =
       (__buckets_ptr)(next_fsm_state->next_state_fn_ln_)._M_h._M_bucket_count;
  debug_info._M_h._M_bucket_count = 0;
  debug_info._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)(next_fsm_state->next_state_fn_ln_)._M_h._M_element_count;
  debug_info._M_h._M_element_count =
       *(size_type *)&(next_fsm_state->next_state_fn_ln_)._M_h._M_rehash_policy;
  debug_info._M_h._M_rehash_policy._0_8_ =
       (next_fsm_state->next_state_fn_ln_)._M_h._M_rehash_policy._M_next_resize;
  debug_info._M_h._M_rehash_policy._M_next_resize = 0;
  auStack_58 = (undefined1  [8])auStack_a0;
  std::
  _Hashtable<kratos::FSMState*,std::pair<kratos::FSMState*const,std::pair<std::__cxx11::string,unsigned_int>>,std::allocator<std::pair<kratos::FSMState*const,std::pair<std::__cxx11::string,unsigned_int>>>,std::__detail::_Select1st,std::equal_to<kratos::FSMState*>,std::hash<kratos::FSMState*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign<std::_Hashtable<kratos::FSMState*,std::pair<kratos::FSMState*const,std::pair<std::__cxx11::string,unsigned_int>>,std::allocator<std::pair<kratos::FSMState*const,std::pair<std::__cxx11::string,unsigned_int>>>,std::__detail::_Select1st,std::equal_to<kratos::FSMState*>,std::hash<kratos::FSMState*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<kratos::FSMState*const,std::pair<std::__cxx11::string,unsigned_int>>,false>>>>
            ((_Hashtable<kratos::FSMState*,std::pair<kratos::FSMState*const,std::pair<std::__cxx11::string,unsigned_int>>,std::allocator<std::pair<kratos::FSMState*const,std::pair<std::__cxx11::string,unsigned_int>>>,std::__detail::_Select1st,std::equal_to<kratos::FSMState*>,std::hash<kratos::FSMState*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)auStack_a0,&(next_fsm_state->next_state_fn_ln_)._M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<kratos::FSMState_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_false>_>_>
              *)auStack_58);
  if (*(char *)((long)&(enum_def->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent[5].
                       _M_right + 4) == '\x01') {
    uVar4 = (ulong)debug_info._M_h._M_single_bucket % (ulong)debug_info._M_h._M_buckets;
    peVar1 = (&(((enable_shared_from_this<kratos::Enum> *)auStack_a0)->_M_weak_this).
               super___weak_ptr<kratos::Enum,_(__gnu_cxx::_Lock_policy)2>._M_ptr)[uVar4];
    if (peVar1 != (element_type *)0x0) {
      plVar5 = *(long **)&(peVar1->super_enable_shared_from_this<kratos::Enum>)._M_weak_this.
                          super___weak_ptr<kratos::Enum,_(__gnu_cxx::_Lock_policy)2>;
      p_Var2 = (__node_base_ptr)plVar5[1];
      plVar6 = plVar5;
      if (debug_info._M_h._M_single_bucket != p_Var2) {
        do {
          plVar6 = (long *)*plVar6;
          if ((plVar6 == (long *)0x0) ||
             ((ulong)plVar6[1] % (ulong)debug_info._M_h._M_buckets != uVar4)) goto LAB_001e5c09;
        } while (debug_info._M_h._M_single_bucket != (__node_base_ptr)plVar6[1]);
        while (debug_info._M_h._M_single_bucket != p_Var2) {
          plVar5 = (long *)*plVar5;
          if ((plVar5 == (long *)0x0) ||
             (p_Var2 = (__node_base_ptr)plVar5[1],
             (ulong)p_Var2 % (ulong)debug_info._M_h._M_buckets != uVar4)) {
            std::__throw_out_of_range("_Map_base::at");
          }
        }
      }
      auStack_58 = (undefined1  [8])&stack0xffffffffffffffb8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)auStack_58,plVar5[2],plVar5[3] + plVar5[2]);
      local_38 = *(uint *)(plVar5 + 6);
      std::
      vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
      ::emplace_back<std::pair<std::__cxx11::string,unsigned_int>&>
                ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                  *)((this->fsm_name_)._M_dataplus._M_p + 8),
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                  *)auStack_58);
      if (auStack_58 != (undefined1  [8])&stack0xffffffffffffffb8) {
        operator_delete((void *)auStack_58,local_48 + 1);
      }
    }
LAB_001e5c09:
    auStack_58 = (undefined1  [8])0x247d8f;
    __alloc_node_gen._M_h._0_4_ = 0x16d;
    std::
    vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
    ::emplace_back<std::pair<char_const*,int>>
              ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                *)((this->fsm_name_)._M_dataplus._M_p + 8),(pair<const_char_*,_int> *)auStack_58);
  }
  std::
  _Hashtable<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)auStack_a0);
  sVar7.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar7.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<kratos::AssignStmt>)
         sVar7.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<AssignStmt> FSM::get_next_state_stmt(
    Enum& enum_def, EnumVar& next_state, const FSMState* state, FSMState* next_fsm_state,
    const std::unordered_map<FSMState*, std::string>& state_name_mapping) const {
    auto const& next_fsm_state_name = state_name_mapping.at(next_fsm_state);
    auto stmt = next_state.assign(enum_def.get_enum(next_fsm_state_name), AssignmentType::Blocking);
    auto debug_info = state->next_state_fn_ln();
    if (generator_->debug) {
        if (debug_info.find(next_fsm_state) != debug_info.end()) {
            auto info = debug_info.at(next_fsm_state);
            stmt->fn_name_ln.emplace_back(info);
        }
        stmt->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
    }
    return stmt;
}